

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O2

void BamTools::SwapEndian_64(int64_t *x)

{
  ulong uVar1;
  
  uVar1 = *x;
  *x = uVar1 << 0x38 | (long)uVar1 >> 0x38 | (uVar1 & 0xff00) << 0x28 |
       (ulong)((uint)uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       uVar1 >> 0x28 & 0xff00 | uVar1 >> 0x18 & 0xff0000 | (ulong)((uint)(uVar1 >> 8) & 0xff000000);
  return;
}

Assistant:

API_EXPORT inline void SwapEndian_64(int64_t& x)
{
    x = ((x >> 56) | ((x << 40) & 0x00FF000000000000ll) | ((x << 24) & 0x0000FF0000000000ll) |
         ((x << 8) & 0x000000FF00000000ll) | ((x >> 8) & 0x00000000FF000000ll) |
         ((x >> 24) & 0x0000000000FF0000ll) | ((x >> 40) & 0x000000000000FF00ll) | (x << 56));
}